

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

XML_Convert_Result
unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  byte *pbVar4;
  int iVar3;
  
  while( true ) {
    pbVar4 = (byte *)*fromP;
    if (fromLim <= pbVar4) {
      return XML_CONVERT_COMPLETED;
    }
    if (toLim <= *toP) break;
    uVar2 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)*pbVar4 * 2 + 0x30);
    if (uVar2 == 0) {
      iVar3 = (*enc[3].nameLength)((ENCODING *)enc[3].skipS,(char *)pbVar4);
      uVar2 = (unsigned_short)iVar3;
      pbVar4 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3
                                 ));
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    *fromP = (char *)pbVar4;
    puVar1 = *toP;
    *toP = puVar1 + 1;
    *puVar1 = uVar2;
  }
  if (*toP != toLim) {
    return XML_CONVERT_COMPLETED;
  }
  return XML_CONVERT_OUTPUT_EXHAUSTED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf16(const ENCODING *enc,
                const char **fromP, const char *fromLim,
                unsigned short **toP, const unsigned short *toLim)
{
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  while (*fromP < fromLim && *toP < toLim) {
    unsigned short c = uenc->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)
          uenc->convert(uenc->userData, *fromP);
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}